

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QByteArray *
QtStringBuilder::appendToByteArray<QStringBuilder<char_const(&)[9],QByteArray&>,char>
          (QByteArray *a,QStringBuilder<QStringBuilder<const_char_(&)[9],_QByteArray_&>,_char> *b,
          char param_3)

{
  ArrayOptions *pAVar1;
  char cVar2;
  Data *pDVar3;
  QByteArray *pQVar4;
  size_t __n;
  char *pcVar5;
  long lVar6;
  char *__dest;
  long lVar7;
  
  pDVar3 = (a->d).d;
  lVar7 = (a->d).size;
  lVar6 = (((b->a).b)->d).size;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)a,(AllocationOption)lVar7);
  }
  lVar7 = lVar7 + lVar6 + 9;
  pDVar3 = (a->d).d;
  if (pDVar3 == (Data *)0x0) {
    lVar6 = 0;
  }
  else {
    lVar6 = (((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
            (pDVar3->super_QArrayData).alloc) - (long)((a->d).ptr + (a->d).size);
  }
  if (lVar6 < lVar7) {
    if (pDVar3 == (Data *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar6 = (pDVar3->super_QArrayData).alloc * 2;
    }
    if (lVar6 < lVar7) {
      lVar6 = lVar7;
    }
    if (((pDVar3 == (Data *)0x0) ||
        (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((long)((((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
               (pDVar3->super_QArrayData).alloc) - (long)(a->d).ptr) < lVar6)) {
      lVar7 = (a->d).size;
      if (lVar6 < lVar7) {
        lVar6 = lVar7;
      }
      QByteArray::reallocData((longlong)a,(AllocationOption)lVar6);
    }
    pDVar3 = (a->d).d;
    if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar3->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  pDVar3 = (a->d).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)a,(AllocationOption)(a->d).size);
  }
  __dest = (a->d).ptr + (a->d).size;
  pcVar5 = *(b->a).a;
  cVar2 = *pcVar5;
  while (cVar2 != '\0') {
    pcVar5 = pcVar5 + 1;
    *__dest = cVar2;
    __dest = __dest + 1;
    cVar2 = *pcVar5;
  }
  pQVar4 = (b->a).b;
  __n = (pQVar4->d).size;
  if (__n != 0) {
    memcpy(__dest,(pQVar4->d).ptr,__n);
  }
  __dest[__n] = b->b;
  QByteArray::resize((longlong)a);
  return a;
}

Assistant:

QByteArray &appendToByteArray(QByteArray &a, const QStringBuilder<A, B> &b, char)
{
    // append 8-bit data to a byte array
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    char *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    a.resize(len); //we need to resize after the appendTo for the case str+=foo+str
    return a;
}